

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  Vec3fx VVar5;
  CachedAllocator alloc_00;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ulong uVar7;
  size_t i_1;
  long lVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar9;
  float *pfVar10;
  size_t sVar11;
  undefined8 *puVar12;
  ulong uVar13;
  range<unsigned_int> *current_00;
  ulong uVar14;
  ulong uVar15;
  range<unsigned_int> rVar16;
  uint uVar17;
  ulong uVar18;
  range<unsigned_int> rVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  Vec3fx *pVVar24;
  bool bVar25;
  ulong local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  undefined8 uStack_250;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_240;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
  *local_238;
  range<unsigned_int> local_230;
  range<unsigned_int> children [8];
  undefined1 local_1e8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1d8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1c8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  
  this_00 = alloc.alloc;
  pTVar6 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)bounds,"depth limit reached",(allocator *)children);
    *puVar12 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar12 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar12 + 2),(string *)bounds);
    __cxa_throw(puVar12,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar20 = (this->super_Settings).maxLeafSize;
  if (current->_end - current->_begin <= uVar20) {
    CreateMortonLeaf<4,_embree::TriangleM<4>_>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
    return __return_storage_ptr__;
  }
  children[0] = *current;
  uVar23 = (this->super_Settings).branchingFactor;
  uVar13 = 1;
  do {
    uVar15 = 0;
    uVar21 = 0xffffffffffffffff;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      uVar18 = (ulong)(children[uVar14]._end - children[uVar14]._begin);
      uVar7 = uVar14;
      if (uVar18 <= uVar20 || uVar18 <= uVar15) {
        uVar18 = uVar15;
        uVar7 = uVar21;
      }
      uVar21 = uVar7;
      uVar15 = uVar18;
    }
    if (uVar21 == 0xffffffffffffffff) break;
    uVar17 = children[uVar21]._end + children[uVar21]._begin >> 1;
    rVar16._end = children[uVar21]._end;
    rVar16._begin = uVar17;
    rVar19._end = uVar17;
    rVar19._begin = children[uVar21]._begin;
    children[uVar21] = children[uVar13 - 1];
    children[uVar13 - 1] = rVar19;
    children[uVar13] = rVar16;
    uVar13 = uVar13 + 1;
  } while (uVar13 < uVar23);
  local_270 = 0x80;
  rVar16 = (range<unsigned_int>)(alloc.talloc0)->parent;
  if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)((long)rVar16 + 8))->_M_b)._M_p) {
    local_1e8[8] = true;
    local_1e8._0_8_ = rVar16;
    MutexSys::lock((MutexSys *)rVar16);
    if ((((atomic<embree::FastAllocator_*> *)((long)rVar16 + 8))->_M_b)._M_p != (__pointer_type)0x0)
    {
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar16 + 8))->_M_b)._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)rVar16 + 0xa8) + (long)*(void **)((long)rVar16 + 0x68);
      UNLOCK();
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar16 + 8))->_M_b)._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)rVar16 + 0x58) + (long)*(void **)((long)rVar16 + 0x98)) -
           ((long)*(void **)((long)rVar16 + 0x50) + (long)*(void **)((long)rVar16 + 0x90)));
      UNLOCK();
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar16 + 8))->_M_b)._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)rVar16 + 0xb0) + (long)*(void **)((long)rVar16 + 0x70);
      UNLOCK();
    }
    *(void **)((long)rVar16 + 0x68) = (void *)0x0;
    *(void **)((long)rVar16 + 0x70) = (void *)0x0;
    *(void **)((long)rVar16 + 0x58) = (void *)0x0;
    *(void **)((long)rVar16 + 0x60) = (void *)0x0;
    *(void **)((long)rVar16 + 0x48) = (void *)0x0;
    *(void **)((long)rVar16 + 0x50) = (void *)0x0;
    if (this_00 == (FastAllocator *)0x0) {
      *(void **)((long)rVar16 + 0xa8) = (void *)0x0;
      *(void **)((long)rVar16 + 0xb0) = (void *)0x0;
      *(void **)((long)rVar16 + 0x98) = (void *)0x0;
      *(void **)((long)rVar16 + 0xa0) = (void *)0x0;
      *(void **)((long)rVar16 + 0x88) = (void *)0x0;
      *(void **)((long)rVar16 + 0x90) = (void *)0x0;
    }
    else {
      *(void **)((long)rVar16 + 0x60) = (void *)this_00->defaultBlockSize;
      *(void **)((long)rVar16 + 0x88) = (void *)0x0;
      *(void **)((long)rVar16 + 0x90) = (void *)0x0;
      *(void **)((long)rVar16 + 0x98) = (void *)0x0;
      *(void **)((long)rVar16 + 0xa0) = (void *)0x0;
      *(void **)((long)rVar16 + 0xa8) = (void *)0x0;
      *(void **)((long)rVar16 + 0xb0) = (void *)0x0;
      *(void **)((long)rVar16 + 0xa0) = (void *)this_00->defaultBlockSize;
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)((long)rVar16 + 8))->_M_b)._M_p = this_00;
    UNLOCK();
    bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    bounds[0]._8_1_ = 1;
    local_230 = rVar16;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&local_230);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1e8);
  }
  uVar20 = local_270;
  pTVar6->bytesUsed = pTVar6->bytesUsed + local_270;
  sVar11 = pTVar6->cur;
  uVar23 = (ulong)(-(int)sVar11 & 0xf);
  uVar21 = sVar11 + local_270 + uVar23;
  pTVar6->cur = uVar21;
  local_240 = __return_storage_ptr__;
  local_238 = this;
  if (pTVar6->end < uVar21) {
    pTVar6->cur = sVar11;
    uVar23 = pTVar6->allocBlockSize;
    if (local_270 * 4 < uVar23 || local_270 * 4 - uVar23 == 0) {
      bounds[0].ref.ptr = uVar23;
      pcVar22 = (char *)FastAllocator::malloc(this_00,(size_t)bounds);
      pTVar6->ptr = pcVar22;
      sVar11 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar11;
      pTVar6->end = bounds[0].ref.ptr;
      pTVar6->cur = uVar20;
      if (bounds[0].ref.ptr < uVar20) {
        pTVar6->cur = 0;
        bounds[0].ref.ptr = pTVar6->allocBlockSize;
        pcVar22 = (char *)FastAllocator::malloc(this_00,(size_t)bounds);
        pTVar6->ptr = pcVar22;
        sVar11 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar11;
        pTVar6->end = bounds[0].ref.ptr;
        pTVar6->cur = uVar20;
        if (bounds[0].ref.ptr < uVar20) {
          pTVar6->cur = 0;
          pcVar22 = (char *)0x0;
          goto LAB_00451c3d;
        }
      }
      pTVar6->bytesWasted = sVar11;
    }
    else {
      pcVar22 = (char *)FastAllocator::malloc(this_00,(size_t)&local_270);
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar23;
    pcVar22 = pTVar6->ptr + (uVar21 - local_270);
  }
LAB_00451c3d:
  pcVar22[0x60] = '\0';
  pcVar22[0x61] = '\0';
  pcVar22[0x62] = -0x80;
  pcVar22[99] = '\x7f';
  pcVar22[100] = '\0';
  pcVar22[0x65] = '\0';
  pcVar22[0x66] = -0x80;
  pcVar22[0x67] = '\x7f';
  pcVar22[0x68] = '\0';
  pcVar22[0x69] = '\0';
  pcVar22[0x6a] = -0x80;
  pcVar22[0x6b] = '\x7f';
  pcVar22[0x6c] = '\0';
  pcVar22[0x6d] = '\0';
  pcVar22[0x6e] = -0x80;
  pcVar22[0x6f] = '\x7f';
  pcVar22[0x40] = '\0';
  pcVar22[0x41] = '\0';
  pcVar22[0x42] = -0x80;
  pcVar22[0x43] = '\x7f';
  pcVar22[0x44] = '\0';
  pcVar22[0x45] = '\0';
  pcVar22[0x46] = -0x80;
  pcVar22[0x47] = '\x7f';
  pcVar22[0x48] = '\0';
  pcVar22[0x49] = '\0';
  pcVar22[0x4a] = -0x80;
  pcVar22[0x4b] = '\x7f';
  pcVar22[0x4c] = '\0';
  pcVar22[0x4d] = '\0';
  pcVar22[0x4e] = -0x80;
  pcVar22[0x4f] = '\x7f';
  uStack_250 = 0x7f8000007f800000;
  local_258 = (undefined1  [8])0x7f8000007f800000;
  pcVar22[0x20] = '\0';
  pcVar22[0x21] = '\0';
  pcVar22[0x22] = -0x80;
  pcVar22[0x23] = '\x7f';
  pcVar22[0x24] = '\0';
  pcVar22[0x25] = '\0';
  pcVar22[0x26] = -0x80;
  pcVar22[0x27] = '\x7f';
  pcVar22[0x28] = '\0';
  pcVar22[0x29] = '\0';
  pcVar22[0x2a] = -0x80;
  pcVar22[0x2b] = '\x7f';
  pcVar22[0x2c] = '\0';
  pcVar22[0x2d] = '\0';
  pcVar22[0x2e] = -0x80;
  pcVar22[0x2f] = '\x7f';
  pcVar22[0x70] = '\0';
  pcVar22[0x71] = '\0';
  pcVar22[0x72] = -0x80;
  pcVar22[0x73] = -1;
  pcVar22[0x74] = '\0';
  pcVar22[0x75] = '\0';
  pcVar22[0x76] = -0x80;
  pcVar22[0x77] = -1;
  pcVar22[0x78] = '\0';
  pcVar22[0x79] = '\0';
  pcVar22[0x7a] = -0x80;
  pcVar22[0x7b] = -1;
  pcVar22[0x7c] = '\0';
  pcVar22[0x7d] = '\0';
  pcVar22[0x7e] = -0x80;
  pcVar22[0x7f] = -1;
  pcVar22[0x50] = '\0';
  pcVar22[0x51] = '\0';
  pcVar22[0x52] = -0x80;
  pcVar22[0x53] = -1;
  pcVar22[0x54] = '\0';
  pcVar22[0x55] = '\0';
  pcVar22[0x56] = -0x80;
  pcVar22[0x57] = -1;
  pcVar22[0x58] = '\0';
  pcVar22[0x59] = '\0';
  pcVar22[0x5a] = -0x80;
  pcVar22[0x5b] = -1;
  pcVar22[0x5c] = '\0';
  pcVar22[0x5d] = '\0';
  pcVar22[0x5e] = -0x80;
  pcVar22[0x5f] = -1;
  local_268._8_8_ = 0xff800000ff800000;
  local_268._0_8_ = 0xff800000ff800000;
  pcVar22[0x30] = '\0';
  pcVar22[0x31] = '\0';
  pcVar22[0x32] = -0x80;
  pcVar22[0x33] = -1;
  pcVar22[0x34] = '\0';
  pcVar22[0x35] = '\0';
  pcVar22[0x36] = -0x80;
  pcVar22[0x37] = -1;
  pcVar22[0x38] = '\0';
  pcVar22[0x39] = '\0';
  pcVar22[0x3a] = -0x80;
  pcVar22[0x3b] = -1;
  pcVar22[0x3c] = '\0';
  pcVar22[0x3d] = '\0';
  pcVar22[0x3e] = -0x80;
  pcVar22[0x3f] = -1;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    pcVar3 = pcVar22 + lVar8 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
  current_00 = children;
  pVVar24 = &bounds[0].bounds.upper;
  uVar20 = uVar13;
  while (bVar25 = uVar20 != 0, uVar20 = uVar20 - 1, bVar25) {
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf((BVHNodeRecord<embree::NodeRefPtr<4>_> *)local_1e8,local_238,depth + 1,
                    current_00,alloc_00);
    *(uint *)&pVVar24[-2].field_0 = local_1e8._0_4_;
    *(undefined4 *)((long)&pVVar24[-2].field_0 + 4) = local_1e8._4_4_;
    *(undefined8 *)&(((BBox3fx *)(pVVar24 + -1))->lower).field_0 = local_1d8._0_8_;
    *(undefined8 *)((long)&(((BBox3fx *)(pVVar24 + -1))->lower).field_0 + 8) = local_1d8._8_8_;
    *(undefined8 *)&pVVar24->field_0 = local_1c8._0_8_;
    *(undefined8 *)((long)&pVVar24->field_0 + 8) = local_1c8._8_8_;
    current_00 = current_00 + 1;
    pVVar24 = pVVar24 + 3;
  }
  paVar9 = &bounds[0].bounds.upper.field_0;
  for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
    paVar1 = paVar9 + -1;
    auVar4._0_4_ = *(float *)paVar1;
    auVar4._4_4_ = *(float *)((long)paVar1 + 4);
    auVar4._8_4_ = *(float *)((long)paVar1 + 8);
    auVar4._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar5.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar9->field_1;
    _local_258 = minps(_local_258,auVar4);
    local_268 = maxps(local_268,(undefined1  [16])VVar5.field_0);
    *(undefined8 *)(pcVar22 + uVar20 * 8) = *(undefined8 *)(paVar9 + -2);
    *(undefined4 *)(pcVar22 + uVar20 * 4 + 0x20) = auVar4._0_4_;
    *(undefined4 *)(pcVar22 + uVar20 * 4 + 0x40) = auVar4._4_4_;
    *(undefined4 *)(pcVar22 + uVar20 * 4 + 0x60) = auVar4._8_4_;
    *(int *)(pcVar22 + uVar20 * 4 + 0x30) = VVar5.field_0._0_4_;
    *(int *)(pcVar22 + uVar20 * 4 + 0x50) = VVar5.field_0._4_4_;
    *(int *)(pcVar22 + uVar20 * 4 + 0x70) = VVar5.field_0._8_4_;
    paVar9 = paVar9 + 3;
  }
  pfVar10 = bounds[0].bounds.lower.field_0.m128 + 3;
  uVar23 = 0;
  uVar20 = uVar13;
  while (bVar25 = uVar20 != 0, uVar20 = uVar20 - 1, bVar25) {
    uVar23 = uVar23 + (long)(int)*pfVar10;
    pfVar10 = pfVar10 + 0xc;
  }
  if (0xfff < uVar23) {
    pfVar10 = bounds[0].bounds.lower.field_0.m128 + 3;
    for (uVar20 = 0; uVar13 != uVar20; uVar20 = uVar20 + 1) {
      if ((int)*pfVar10 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar22 + uVar20 * 8),1);
        pcVar22[uVar20 * 8 + 7] = pcVar22[uVar20 * 8 + 7] | 0x80;
      }
      pfVar10 = pfVar10 + 0xc;
    }
  }
  (local_240->ref).ptr = (size_t)pcVar22;
  (local_240->bounds).lower.field_0.m128[0] = (float)local_258._0_4_;
  (local_240->bounds).lower.field_0.m128[1] = (float)local_258._4_4_;
  (local_240->bounds).lower.field_0.m128[2] = (float)uStack_250;
  (local_240->bounds).lower.field_0.m128[3] = (float)uVar23;
  *(undefined8 *)&(local_240->bounds).upper.field_0 = local_268._0_8_;
  *(undefined8 *)((long)&(local_240->bounds).upper.field_0 + 8) = local_268._8_8_;
  return local_240;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }